

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetCFBundleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          BundleDirectoryLevel level)

{
  bool bVar1;
  cmValue cVar2;
  string ext;
  cmAlphaNum local_a0;
  undefined1 local_70 [48];
  string local_40;
  
  GetOutputName(&local_40,this,config,RuntimeBinaryArtifact);
  local_a0.View_._M_len = local_40._M_string_length;
  local_a0.View_._M_str = local_40._M_dataplus._M_p;
  local_70._8_8_ = local_70 + 0x10;
  local_70._0_8_ = (pointer)0x1;
  local_70[0x10] = '.';
  cmStrCat<>(__return_storage_ptr__,&local_a0,(cmAlphaNum *)local_70);
  std::__cxx11::string::~string((string *)&local_40);
  local_a0.View_._M_len = (size_t)local_a0.Digits_;
  local_a0.View_._M_str = (char *)0x0;
  local_a0.Digits_[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"BUNDLE_EXTENSION",(allocator<char> *)&local_40);
  cVar2 = GetProperty(this,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  if (cVar2.Value == (string *)0x0) {
    IsXCTestOnApple(this);
    std::__cxx11::string::assign((char *)&local_a0);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_a0);
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  if (((level - ContentLevel < 2) &&
      (bVar1 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile), !bVar1)) &&
     (std::__cxx11::string::append((char *)__return_storage_ptr__), level == FullLevel)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCFBundleDirectory(
  const std::string& config, BundleDirectoryLevel level) const
{
  std::string fpath = cmStrCat(
    this->GetOutputName(config, cmStateEnums::RuntimeBinaryArtifact), '.');
  std::string ext;
  if (cmValue p = this->GetProperty("BUNDLE_EXTENSION")) {
    ext = *p;
  } else {
    if (this->IsXCTestOnApple()) {
      ext = "xctest";
    } else {
      ext = "bundle";
    }
  }
  fpath += ext;
  if (shouldAddContentLevel(level) &&
      !this->Makefile->PlatformIsAppleEmbedded()) {
    fpath += "/Contents";
    if (shouldAddFullLevel(level)) {
      fpath += "/MacOS";
    }
  }
  return fpath;
}